

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSpatialAlgebra.h
# Opt level: O1

btSpatialMotionVector * __thiscall
btSpatialMotionVector::operator+=(btSpatialMotionVector *this,btSpatialMotionVector *vec)

{
  (this->m_topVec).m_floats[0] = (vec->m_topVec).m_floats[0] + (this->m_topVec).m_floats[0];
  (this->m_topVec).m_floats[1] = (vec->m_topVec).m_floats[1] + (this->m_topVec).m_floats[1];
  (this->m_topVec).m_floats[2] = (vec->m_topVec).m_floats[2] + (this->m_topVec).m_floats[2];
  (this->m_bottomVec).m_floats[0] = (vec->m_bottomVec).m_floats[0] + (this->m_bottomVec).m_floats[0]
  ;
  (this->m_bottomVec).m_floats[1] = (vec->m_bottomVec).m_floats[1] + (this->m_bottomVec).m_floats[1]
  ;
  (this->m_bottomVec).m_floats[2] = (vec->m_bottomVec).m_floats[2] + (this->m_bottomVec).m_floats[2]
  ;
  return this;
}

Assistant:

btSpatialMotionVector & operator += (const btSpatialMotionVector &vec) { m_topVec += vec.m_topVec; m_bottomVec += vec.m_bottomVec; return *this; }